

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool CheckChecksum(Span<const_char> *sp,bool require_checksum,string *error,string *out_checksum)

{
  bool bVar1;
  undefined1 uVar2;
  size_type sVar3;
  size_t sVar4;
  char *__end;
  char *__beg;
  reference pvVar5;
  long in_RCX;
  byte in_SIL;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> check_split;
  string checksum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffee0;
  allocator<char> *__a;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffee8;
  unsigned_long *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  undefined7 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  bool local_aa;
  allocator<char> local_a9;
  size_t local_a8;
  undefined8 in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  util::Split<Span<char_const>>
            ((Span<const_char> *)in_stack_fffffffffffffed8,
             (char)((ulong)in_stack_fffffffffffffef8 >> 0x38));
  sVar3 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::size
                    ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                     in_stack_fffffffffffffec8);
  if (2 < sVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffed8,
               (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    local_aa = false;
    goto LAB_00e695d3;
  }
  sVar3 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::size
                    ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                     in_stack_fffffffffffffec8);
  if ((sVar3 == 1) && ((in_SIL & 1) != 0)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffed8,
               (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    local_aa = false;
    goto LAB_00e695d3;
  }
  sVar3 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::size
                    ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                     in_stack_fffffffffffffec8);
  if (sVar3 == 2) {
    std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
              ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
               in_stack_fffffffffffffed8,
               CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    sVar4 = Span<const_char>::size((Span<const_char> *)in_stack_fffffffffffffec8);
    if (sVar4 != 8) {
      std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                 in_stack_fffffffffffffed8,
                 CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      local_a8 = Span<const_char>::size((Span<const_char> *)in_stack_fffffffffffffec8);
      tinyformat::format<unsigned_long>(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffff28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      std::__cxx11::string::~string(in_stack_fffffffffffffec8);
      local_aa = false;
      goto LAB_00e695d3;
    }
  }
  std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
             in_stack_fffffffffffffed8,CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0)
            );
  (anonymous_namespace)::DescriptorChecksum_abi_cxx11_
            ((Span<const_char> *)in_stack_ffffffffffffff68);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (in_stack_fffffffffffffec8);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffed8,
               (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    local_aa = false;
  }
  else {
    sVar3 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::size
                      ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                       in_stack_fffffffffffffec8);
    if (sVar3 == 2) {
      args = local_48;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                (in_stack_fffffffffffffec8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                (in_stack_fffffffffffffed8);
      std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                 in_stack_fffffffffffffed8,
                 CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffffec8);
      uVar2 = std::equal<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char_const*>
                        (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                         (char *)in_stack_fffffffffffffec8);
      if (!(bool)uVar2) {
        in_stack_fffffffffffffed8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff60;
        __a = (allocator<char> *)0x1;
        std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                  ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                   in_stack_fffffffffffffed8,
                   CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
        __end = Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffffec8);
        std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                  ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                   in_stack_fffffffffffffed8,
                   CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
        __beg = Span<const_char>::end((Span<const_char> *)in_stack_fffffffffffffec8);
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>(this,__beg,__end,__a);
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  ((char *)CONCAT17(uVar2,in_stack_ffffffffffffff08),args,this);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_ffffffffffffff28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        std::__cxx11::string::~string(in_stack_fffffffffffffec8);
        std::__cxx11::string::~string(in_stack_fffffffffffffec8);
        std::allocator<char>::~allocator(&local_a9);
        local_aa = false;
        goto LAB_00e695b5;
      }
    }
    if (in_RCX != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffff28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
    pvVar5 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::operator[]
                       ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                        in_stack_fffffffffffffed8,
                        CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    *in_RDI = pvVar5->m_data;
    in_RDI[1] = pvVar5->m_size;
    local_aa = true;
  }
LAB_00e695b5:
  std::__cxx11::string::~string(in_stack_fffffffffffffec8);
LAB_00e695d3:
  std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::~vector
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
             in_stack_fffffffffffffed8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_aa;
}

Assistant:

bool CheckChecksum(Span<const char>& sp, bool require_checksum, std::string& error, std::string* out_checksum = nullptr)
{
    auto check_split = Split(sp, '#');
    if (check_split.size() > 2) {
        error = "Multiple '#' symbols";
        return false;
    }
    if (check_split.size() == 1 && require_checksum){
        error = "Missing checksum";
        return false;
    }
    if (check_split.size() == 2) {
        if (check_split[1].size() != 8) {
            error = strprintf("Expected 8 character checksum, not %u characters", check_split[1].size());
            return false;
        }
    }
    auto checksum = DescriptorChecksum(check_split[0]);
    if (checksum.empty()) {
        error = "Invalid characters in payload";
        return false;
    }
    if (check_split.size() == 2) {
        if (!std::equal(checksum.begin(), checksum.end(), check_split[1].begin())) {
            error = strprintf("Provided checksum '%s' does not match computed checksum '%s'", std::string(check_split[1].begin(), check_split[1].end()), checksum);
            return false;
        }
    }
    if (out_checksum) *out_checksum = std::move(checksum);
    sp = check_split[0];
    return true;
}